

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O2

LevenshteinDFA *
la::LevenshteinDFA::SubsetConstruct(LevenshteinDFA *__return_storage_ptr__,LevenshteinNFA *nfa)

{
  list<int,_std::allocator<int>_> *this;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  byte *__args;
  byte bVar1;
  int iVar2;
  mapped_type mVar3;
  mapped_type *pmVar4;
  list<char,_std::allocator<char>_> *this_01;
  _List_iterator<std::__cxx11::list<int,_std::allocator<int>_>_> _Var5;
  iterator iVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  _List_node_base *this_02;
  long lVar9;
  int i_2;
  _Fwd_list_impl _Var10;
  int i;
  _List_node_base *p_Var11;
  ulong uVar12;
  int local_17c;
  _List_base<int,_std::allocator<int>_> local_178;
  uint local_15c;
  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
  vec_tmp;
  list<int,_std::allocator<int>_> next;
  list<int,_std::allocator<int>_> aState;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  unmarkedStates;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  markedStates;
  list<int,_std::allocator<int>_> first;
  list<int,_std::allocator<int>_> nfaInitial;
  map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  dfaStateNum;
  
  LevenshteinDFA(__return_storage_ptr__);
  markedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&markedStates;
  markedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node._M_size = 0;
  unmarkedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&unmarkedStates;
  unmarkedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node._M_size = 0;
  dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_header;
  dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&nfaInitial;
  nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  unmarkedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       unmarkedStates.
       super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  markedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       markedStates.
       super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
            super__List_node_base._M_next;
  dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::list<int,std::allocator<int>>::emplace_back<int_const&>
            ((list<int,std::allocator<int>> *)
             nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next,&nfa->_initialState);
  EpsilonClosure(&first,nfa,&nfaInitial);
  std::__cxx11::
  list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
  ::emplace_back<std::__cxx11::list<int,std::allocator<int>>&>
            ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
              *)&unmarkedStates,&first);
  pmVar4 = std::
           map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
           ::operator[](&dfaStateNum,&first);
  *pmVar4 = 0;
  this = &__return_storage_ptr__->_finalStates;
  this_00 = &__return_storage_ptr__->_defaultTrans;
  this_01 = &__return_storage_ptr__->_uniqueChars;
  local_17c = 1;
  while (this_02 = (_List_node_base *)&aState,
        unmarkedStates.
        super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
        ._M_impl._M_node._M_size != 0) {
    std::__cxx11::list<int,_std::allocator<int>_>::list
              ((list<int,_std::allocator<int>_> *)this_02,
               (list<int,_std::allocator<int>_> *)
               (unmarkedStates.
                super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::
    list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
    ::pop_front(&unmarkedStates);
    std::__cxx11::
    list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
    ::emplace_back<std::__cxx11::list<int,std::allocator<int>>&>
              ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                *)&markedStates,(list<int,_std::allocator<int>_> *)this_02);
    while (this_02 = (((list<int,_std::allocator<int>_> *)this_02)->
                     super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
                     super__List_node_base._M_next, p_Var11 = (_List_node_base *)&nfa->_finalStates,
          this_02 != (_List_node_base *)&aState) {
      while (p_Var11 = (((_List_base<int,_std::allocator<int>_> *)&p_Var11->_M_next)->_M_impl).
                       _M_node.super__List_node_base._M_next,
            p_Var11 != (_List_node_base *)&nfa->_finalStates) {
        if (*(int *)&this_02[1]._M_next == *(int *)&p_Var11[1]._M_next) {
          pmVar4 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[](&dfaStateNum,&aState);
          std::__cxx11::list<int,std::allocator<int>>::emplace_back<int&>
                    ((list<int,std::allocator<int>> *)this,pmVar4);
        }
      }
    }
    vec_tmp.
    super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vec_tmp.
    super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vec_tmp.
    super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_15c = 0;
    _Var10._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)&nfa->_inputs;
    while( true ) {
      _Var10._M_head._M_next =
           (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var10._M_head._M_next)->_M_next;
      if ((_Fwd_list_impl)_Var10._M_head._M_next == (_Fwd_list_impl)0x0) break;
      LevenshteinNFA::Move
                ((list<int,_std::allocator<int>_> *)&local_178,nfa,&aState,
                 *(char *)((long)_Var10._M_head._M_next + 8));
      EpsilonClosure(&next,nfa,(list<int,_std::allocator<int>_> *)&local_178);
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear(&local_178);
      if (next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
          _M_next != (_List_node_base *)&next) {
        _Var5 = std::
                __find_if<std::_List_iterator<std::__cxx11::list<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::list<int,std::allocator<int>>const>>
                          (unmarkedStates.
                           super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next,
                           (_List_node_base *)&unmarkedStates,(_List_node_base *)&next);
        if ((_Var5._M_node == (_List_node_base *)&unmarkedStates) &&
           (_Var5 = std::
                    __find_if<std::_List_iterator<std::__cxx11::list<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::list<int,std::allocator<int>>const>>
                              (markedStates.
                               super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next,
                               (_List_node_base *)&markedStates,&next),
           _Var5._M_node == (_List_node_base *)&markedStates)) {
          std::__cxx11::
          list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
          ::emplace_back<std::__cxx11::list<int,std::allocator<int>>&>
                    ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                      *)&unmarkedStates,&next);
          local_178._M_impl._M_node.super__List_node_base._M_next =
               (_List_node_base *)
               CONCAT44(local_178._M_impl._M_node.super__List_node_base._M_next._4_4_,local_17c);
          std::
          _Rb_tree<std::__cxx11::list<int,std::allocator<int>>,std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>,std::_Select1st<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
          ::_M_emplace_unique<std::__cxx11::list<int,std::allocator<int>>&,int>
                    ((_Rb_tree<std::__cxx11::list<int,std::allocator<int>>,std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>,std::_Select1st<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
                      *)&dfaStateNum,&next,(int *)&local_178);
          local_17c = local_17c + 1;
        }
        __args = (byte *)((long)_Var10._M_head._M_next + 8);
        if ((*__args | 2) == 0x7e) {
          pmVar4 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[](&dfaStateNum,&aState);
          iVar6 = std::
                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&this_00->_M_h,pmVar4);
          if (iVar6.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
              (__node_type *)0x0) {
            pmVar4 = std::
                     map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](&dfaStateNum,&aState);
            pmVar7 = std::
                     map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](&dfaStateNum,&next);
            std::
            _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<int&,int&>
                      ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,pmVar4,pmVar7);
            lVar9 = 0;
            for (uVar12 = 0;
                uVar8 = ((long)vec_tmp.
                               super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vec_tmp.
                              super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc, uVar12 < uVar8;
                uVar12 = uVar12 + 1) {
              iVar2 = *(int *)((long)&((vec_tmp.
                                        super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).first +
                              lVar9);
              pmVar4 = std::
                       map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                       ::operator[](&dfaStateNum,&aState);
              if ((iVar2 != *pmVar4) ||
                 (iVar2 = *(int *)((long)&(vec_tmp.
                                           super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second +
                                  lVar9),
                 pmVar4 = std::
                          map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          ::operator[](&dfaStateNum,&next), iVar2 != *pmVar4)) {
                local_178._M_impl._M_node.super__List_node_base._M_next =
                     *(_List_node_base **)
                      ((long)&((vec_tmp.
                                super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first).first + lVar9);
                local_178._M_impl._M_node.super__List_node_base._M_prev._0_4_ =
                     *(mapped_type *)
                      ((long)&(vec_tmp.
                               super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->second + lVar9);
                std::
                _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                ::_M_emplace_unique<std::pair<std::pair<int,char>,int>>
                          ((_Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                            *)&__return_storage_ptr__->_transTable,
                           (pair<std::pair<int,_char>,_int> *)&local_178);
              }
              lVar9 = lVar9 + 0xc;
            }
            local_15c = (uint)CONCAT71((int7)(uVar8 >> 8),1);
          }
        }
        else {
          std::__cxx11::list<char,std::allocator<char>>::emplace_back<char_const&>
                    ((list<char,std::allocator<char>> *)this_01,(char *)__args);
          pmVar4 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[](&dfaStateNum,&aState);
          mVar3 = *pmVar4;
          bVar1 = *__args;
          pmVar4 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[](&dfaStateNum,&next);
          local_178._M_impl._M_node.super__List_node_base._M_next._4_1_ = bVar1;
          local_178._M_impl._M_node.super__List_node_base._M_next._0_4_ = mVar3;
          local_178._M_impl._M_node.super__List_node_base._M_next._5_3_ = 0;
          local_178._M_impl._M_node.super__List_node_base._M_prev._0_4_ = *pmVar4;
          std::
          vector<std::pair<std::pair<int,char>,int>,std::allocator<std::pair<std::pair<int,char>,int>>>
          ::emplace_back<std::pair<std::pair<int,char>,int>>
                    ((vector<std::pair<std::pair<int,char>,int>,std::allocator<std::pair<std::pair<int,char>,int>>>
                      *)&vec_tmp,(pair<std::pair<int,_char>,_int> *)&local_178);
        }
      }
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                (&next.super__List_base<int,_std::allocator<int>_>);
    }
    if ((local_15c & 1) == 0) {
      next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
      ._0_4_ = 0;
      next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
      lVar9 = 8;
      for (uVar12 = 0;
          uVar12 < (ulong)(((long)vec_tmp.
                                  super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)vec_tmp.
                                 super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar12 = uVar12 + 1) {
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&next,(key_type *)
                                     ((long)&((vec_tmp.
                                               super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             first + lVar9));
        *pmVar4 = *pmVar4 + 1;
        lVar9 = lVar9 + 0xc;
      }
      lVar9 = 8;
      for (uVar12 = 0;
          uVar12 < (ulong)(((long)vec_tmp.
                                  super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)vec_tmp.
                                 super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar12 = uVar12 + 1) {
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&next,(key_type *)
                                     ((long)&((vec_tmp.
                                               super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             first + lVar9));
        if (*pmVar4 == 1) {
          local_178._M_impl._M_node.super__List_node_base._M_next =
               *(_List_node_base **)
                ((long)vec_tmp.
                       super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
          local_178._M_impl._M_node.super__List_node_base._M_prev._0_4_ =
               *(mapped_type *)
                ((long)&((vec_tmp.
                          super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first).first + lVar9);
          std::
          _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
          ::_M_emplace_unique<std::pair<std::pair<int,char>,int>>
                    ((_Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                      *)&__return_storage_ptr__->_transTable,
                     (pair<std::pair<int,_char>,_int> *)&local_178);
        }
        else {
          std::
          _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<int&,int&>
                    ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,
                     (long)vec_tmp.
                           super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8,
                     (long)&((vec_tmp.
                              super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first).first + lVar9);
        }
        lVar9 = lVar9 + 0xc;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&next);
    }
    std::
    _Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
    ::~_Vector_base(&vec_tmp.
                     super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                   );
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              (&aState.super__List_base<int,_std::allocator<int>_>);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::sort(this);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(this);
  std::__cxx11::list<char,_std::allocator<char>_>::sort(this_01);
  std::__cxx11::list<char,_std::allocator<char>_>::unique(this_01);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&first.super__List_base<int,_std::allocator<int>_>);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&nfaInitial.super__List_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::list<int,_std::allocator<int>_>,_std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  ::~_Rb_tree(&dfaStateNum._M_t);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&unmarkedStates.
              super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&markedStates.
              super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            );
  return __return_storage_ptr__;
}

Assistant:

LevenshteinDFA LevenshteinDFA::SubsetConstruct(const LevenshteinNFA &nfa)
    {
        LevenshteinDFA dfa{};
        int num = 0;

        std::list<std::list<int>> markedStates;
        std::list<std::list<int>> unmarkedStates;

        std::map<std::list<int>, int> dfaStateNum;

        std::list<int> nfaInitial;
        nfaInitial.emplace_back(nfa._initialState);

        std::list<int> first = EpsilonClosure(nfa, nfaInitial);
        unmarkedStates.emplace_back(first);

        //the initial dfa state
        int dfaInitial = num++;
        dfaStateNum[first] = dfaInitial;

        while (unmarkedStates.size() != 0)
        {
            bool tag=false;
            std::list<int> aState = unmarkedStates.front();
            unmarkedStates.pop_front();

            markedStates.emplace_back(aState);

            //Kinda killer, should redo
            for (std::list<int>::iterator it = aState.begin(); it != aState.end();++it)
            {
                for (auto it2 = nfa._finalStates.begin(); it2 != nfa._finalStates.end();++it2)
                {
                    if (*it == *it2)
                    {
                        dfa._finalStates.emplace_back(dfaStateNum[aState]);
                    }
                }
            }
            std::vector<std::pair<std::pair<int,char>,int>> vec_tmp;
//            for each (char c in nfa->inputs)
            for  (const char &c : nfa._inputs)
            {
                std::list<int> next = EpsilonClosure(nfa, nfa.Move(aState, c));
                if (next.empty()) continue;
                if (std::find(unmarkedStates.begin(), unmarkedStates.end(), next) == unmarkedStates.end() &&
                    std::find(markedStates.begin(), markedStates.end(), next) == markedStates.end())
                {
                    unmarkedStates.emplace_back(next);
                    dfaStateNum.emplace(next, num++);
                }
                if (c != (char)LevenshteinNFA::Constants::Insertion && c != (char)LevenshteinNFA::Constants::Deletion)
                {
                    dfa._uniqueChars.emplace_back(c);
                    std::pair<int, char> transition = std::make_pair(dfaStateNum[aState],c);
                    vec_tmp.push_back(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                   // dfa->transTable->insert(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                }
                else
                {
                    auto it = dfa._defaultTrans.find(dfaStateNum[aState]);
                    //TODO 数字 ascli值太大
                    if (it == dfa._defaultTrans.end())
                    {
                        dfa._defaultTrans.emplace(dfaStateNum[aState], dfaStateNum[next]);
                        tag = true;
                        for(int i=0;i<vec_tmp.size();i++){
                            if(!(vec_tmp[i].first.first == dfaStateNum[aState]&& vec_tmp[i].second == dfaStateNum[next])){
                                dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                            }

                        }
                    }
                }
            }
            if(!tag){
                std::map<int,int> map_tmp;
                for(int i=0;i<vec_tmp.size();i++){
                        map_tmp[vec_tmp[i].second]++;
                }
                for(int i=0;i<vec_tmp.size();i++){
                    //printf("%d %d %d\n",vec_tmp[i].second,map_tmp[vec_tmp[i].second],vec_tmp.size());
                    if(map_tmp[vec_tmp[i].second]==1){
                        dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                    }
                    else{
                        dfa._defaultTrans.emplace(vec_tmp[i].first.first,vec_tmp[i].second);
                    }
                }
            }
        }
        dfa._finalStates.sort();
        dfa._finalStates.unique();
        dfa._uniqueChars.sort();
        dfa._uniqueChars.unique();
        return dfa;
    }